

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall cs_impl::any::holder<cs::pointer>::duplicate(holder<cs::pointer> *this)

{
  proxy *ppVar1;
  baseHolder *pbVar2;
  
  if ((DAT_0033ff18 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::structure>::allocator + DAT_0033ff18 * 8);
    DAT_0033ff18 = DAT_0033ff18 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_0032f208;
  ppVar1 = (this->mDat).data.mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  pbVar2[1]._vptr_baseHolder = (_func_int **)ppVar1;
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}